

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::StructDef::Deserialize(StructDef *this,Parser *parser,Object *object)

{
  uint uVar1;
  pointer puVar2;
  Object *this_00;
  bool bVar3;
  uint16_t uVar4;
  uint uVar5;
  uint uVar6;
  int32_t iVar7;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  String *this_01;
  Value *pVVar8;
  return_type pFVar9;
  reference pvVar10;
  FieldDef *this_02;
  size_t sVar11;
  size_t local_1e8;
  Field *local_1d8;
  byte local_149;
  return_type next_field;
  size_t size;
  FieldDef *field_def;
  return_type field;
  size_t i_1;
  size_t tmp_struct_size;
  uoffset_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *of;
  string local_98;
  string local_68;
  string local_48;
  Object *local_28;
  Object *object_local;
  Parser *parser_local;
  StructDef *this_local;
  
  local_28 = object;
  object_local = (Object *)parser;
  parser_local = (Parser *)this;
  attrs = reflection::Object::attributes(object);
  bVar3 = Definition::DeserializeAttributes(&this->super_Definition,parser,attrs);
  if (bVar3) {
    documentation = reflection::Object::documentation(local_28);
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    this_00 = object_local;
    this_01 = reflection::Object::name(local_28);
    String::str_abi_cxx11_(&local_68,this_01);
    Parser::UnqualifiedName(&local_48,(Parser *)this_00,&local_68);
    std::__cxx11::string::operator=((string *)this,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    this->predecl = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"original_order",(allocator<char> *)((long)&of + 7));
    pVVar8 = SymbolTable<flatbuffers::Value>::Lookup(&(this->super_Definition).attributes,&local_98)
    ;
    local_149 = 0;
    if (pVVar8 == (Value *)0x0) {
      local_149 = this->fixed ^ 0xff;
    }
    this->sortbysize = (bool)(local_149 & 1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&of + 7));
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)reflection::Object::fields(local_28);
    uVar5 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size
                      ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)
                       indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&tmp_struct_size + 7))
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)uVar5,
               (allocator<unsigned_int> *)((long)&tmp_struct_size + 7));
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)((long)&tmp_struct_size + 7));
    for (tmp_struct_size._0_4_ = 0; uVar5 = (uint)tmp_struct_size,
        uVar6 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size
                          ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)
                           indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage),
        uVar1 = (uint)tmp_struct_size, uVar5 < uVar6;
        tmp_struct_size._0_4_ = (uint)tmp_struct_size + 1) {
      pFVar9 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                         ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)
                          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(uint)tmp_struct_size);
      uVar4 = reflection::Field::id(pFVar9);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)uVar4);
      *pvVar10 = uVar1;
    }
    i_1 = 0;
    for (field = (return_type)0x0;
        pFVar9 = (return_type)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i),
        puVar2 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, field < pFVar9; field = field + 1) {
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                           (size_type_conflict)field);
      pFVar9 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                         ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)puVar2,
                          *pvVar10);
      this_02 = (FieldDef *)operator_new(0x138);
      FieldDef::FieldDef(this_02);
      bVar3 = FieldDef::Deserialize(this_02,(Parser *)object_local,pFVar9);
      if ((!bVar3) ||
         (bVar3 = SymbolTable<flatbuffers::FieldDef>::Add(&this->fields,(string *)this_02,this_02),
         bVar3)) {
        if (this_02 != (FieldDef *)0x0) {
          FieldDef::~FieldDef(this_02);
          operator_delete(this_02,0x138);
        }
        this_local._7_1_ = 0;
        goto LAB_0014e6d6;
      }
      if ((this_02->key & 1U) != 0) {
        if ((this->has_key & 1U) != 0) {
          if (this_02 != (FieldDef *)0x0) {
            FieldDef::~FieldDef(this_02);
            operator_delete(this_02,0x138);
          }
          this_local._7_1_ = 0;
          goto LAB_0014e6d6;
        }
        this->has_key = true;
      }
      if ((this->fixed & 1U) != 0) {
        sVar11 = InlineSize(&(this_02->value).type);
        pFVar9 = (return_type)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
        puVar2 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (field + 1 < pFVar9) {
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                               (size_type_conflict)(field + 1));
          local_1d8 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                                ((Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *)
                                 puVar2,*pvVar10);
        }
        else {
          local_1d8 = (Field *)0x0;
        }
        if (local_1d8 == (Field *)0x0) {
          local_1e8 = PaddingBytes(sVar11 + i_1,this->minalign);
        }
        else {
          uVar4 = reflection::Field::offset(local_1d8);
          local_1e8 = (long)(int)((uint)uVar4 - (uint)(this_02->value).offset) - sVar11;
        }
        this_02->padding = local_1e8;
        i_1 = this_02->padding + sVar11 + i_1;
      }
    }
    iVar7 = reflection::Object::bytesize(local_28);
    if ((int)i_1 != iVar7) {
      __assert_fail("static_cast<int>(tmp_struct_size) == object->bytesize()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                    ,0xfc0,
                    "bool flatbuffers::StructDef::Deserialize(Parser &, const reflection::Object *)"
                   );
    }
    this_local._7_1_ = 1;
LAB_0014e6d6:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StructDef::Deserialize(Parser &parser, const reflection::Object *object) {
  if (!DeserializeAttributes(parser, object->attributes())) return false;
  DeserializeDoc(doc_comment, object->documentation());
  name = parser.UnqualifiedName(object->name()->str());
  predecl = false;
  sortbysize = attributes.Lookup("original_order") == nullptr && !fixed;
  const auto &of = *(object->fields());
  auto indexes = std::vector<uoffset_t>(of.size());
  for (uoffset_t i = 0; i < of.size(); i++) indexes[of.Get(i)->id()] = i;
  size_t tmp_struct_size = 0;
  for (size_t i = 0; i < indexes.size(); i++) {
    auto field = of.Get(indexes[i]);
    auto field_def = new FieldDef();
    if (!field_def->Deserialize(parser, field) ||
        fields.Add(field_def->name, field_def)) {
      delete field_def;
      return false;
    }
    if (field_def->key) {
      if (has_key) {
        // only one field may be set as key
        delete field_def;
        return false;
      }
      has_key = true;
    }
    if (fixed) {
      // Recompute padding since that's currently not serialized.
      auto size = InlineSize(field_def->value.type);
      auto next_field =
          i + 1 < indexes.size() ? of.Get(indexes[i + 1]) : nullptr;
      tmp_struct_size += size;
      field_def->padding =
          next_field ? (next_field->offset() - field_def->value.offset) - size
                     : PaddingBytes(tmp_struct_size, minalign);
      tmp_struct_size += field_def->padding;
    }
  }
  FLATBUFFERS_ASSERT(static_cast<int>(tmp_struct_size) == object->bytesize());
  return true;
}